

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

Variant * __thiscall
Jinx::Impl::Script::GetVariable(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  ulong uVar1;
  bool bVar2;
  pointer pIVar3;
  size_type sVar4;
  const_reference copy;
  undefined1 local_30 [16];
  const_reverse_iterator ritr;
  RuntimeID id_local;
  Script *this_local;
  
  ritr.current._M_current =
       (__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>
        )(__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>
          )id;
  std::
  vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
  ::rbegin((vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
            *)(local_30 + 8));
  while( true ) {
    std::
    vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
    ::rend((vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
            *)local_30);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                             *)(local_30 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                             *)local_30);
    if (!bVar2) {
      Jinx::Variant::Variant(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pIVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                           *)(local_30 + 8));
    if ((IdIndexData *)pIVar3->id == ritr.current._M_current) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                  *)(local_30 + 8));
  }
  pIVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                         *)(local_30 + 8));
  uVar1 = pIVar3->index;
  sVar4 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::size
                    (&this->m_stack);
  if (sVar4 <= uVar1) {
    LogWriteLine(Error,"Attempted to access stack at invalid index");
    Jinx::Variant::Variant(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pIVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_Jinx::Impl::Script::IdIndexData_*,_std::vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>_>_>
                         *)(local_30 + 8));
  copy = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::operator[]
                   (&this->m_stack,pIVar3->index);
  Jinx::Variant::Variant(__return_storage_ptr__,copy);
  return __return_storage_ptr__;
}

Assistant:

inline Variant Script::GetVariable(RuntimeID id) const
	{
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->id == id)
			{
				if (ritr->index >= m_stack.size())
				{
					LogWriteLine(LogLevel::Error, "Attempted to access stack at invalid index");
					return Variant();
				}
				return m_stack[ritr->index];
			}
		}
		return Variant();
	}